

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O0

GLFWglproc getProcAddressGLX(char *procname)

{
  GLubyte *in_RDI;
  __GLXextproc local_8;
  
  if (_glfw.glx.GetProcAddress == (PFNGLXGETPROCADDRESSPROC)0x0) {
    if (_glfw.glx.GetProcAddressARB == (PFNGLXGETPROCADDRESSPROC)0x0) {
      local_8 = (__GLXextproc)dlsym(_glfw.glx.handle,in_RDI);
    }
    else {
      local_8 = (*_glfw.glx.GetProcAddressARB)(in_RDI);
    }
  }
  else {
    local_8 = (*_glfw.glx.GetProcAddress)(in_RDI);
  }
  return local_8;
}

Assistant:

static GLFWglproc getProcAddressGLX(const char* procname)
{
    if (_glfw.glx.GetProcAddress)
        return _glfw.glx.GetProcAddress((const GLubyte*) procname);
    else if (_glfw.glx.GetProcAddressARB)
        return _glfw.glx.GetProcAddressARB((const GLubyte*) procname);
    else
        return _glfw_dlsym(_glfw.glx.handle, procname);
}